

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

int xmlTextReaderPreservePattern(xmlTextReaderPtr reader,xmlChar *pattern,xmlChar **namespaces)

{
  uint uVar1;
  uint uVar2;
  xmlPatternPtr pxVar3;
  xmlPatternPtr *ppxVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  
  iVar5 = -1;
  if (pattern == (xmlChar *)0x0 || reader == (xmlTextReaderPtr)0x0) {
    return -1;
  }
  pxVar3 = xmlPatterncompile(pattern,reader->dict,0,namespaces);
  if (pxVar3 == (xmlPatternPtr)0x0) {
    return -1;
  }
  uVar1 = reader->patternMax;
  if (reader->patternNr < (int)uVar1) {
    ppxVar4 = reader->patternTab;
    iVar5 = reader->patternNr;
LAB_00179369:
    ppxVar4[iVar5] = pxVar3;
    reader->patternNr = iVar5 + 1;
  }
  else {
    if ((int)uVar1 < 1) {
      uVar7 = 4;
LAB_00179339:
      ppxVar4 = (xmlPatternPtr *)(*xmlRealloc)(reader->patternTab,uVar7 << 3);
      if (ppxVar4 != (xmlPatternPtr *)0x0) {
        reader->patternTab = ppxVar4;
        reader->patternMax = (int)uVar7;
        iVar5 = reader->patternNr;
        goto LAB_00179369;
      }
    }
    else if (uVar1 < 1000000000) {
      uVar6 = uVar1 + 1 >> 1;
      uVar2 = uVar6 + uVar1;
      if (1000000000 - uVar6 < uVar1) {
        uVar2 = 1000000000;
      }
      uVar7 = (ulong)uVar2;
      goto LAB_00179339;
    }
    xmlTextReaderErrMemory(reader);
  }
  return iVar5;
}

Assistant:

int
xmlTextReaderPreservePattern(xmlTextReaderPtr reader, const xmlChar *pattern,
                             const xmlChar **namespaces)
{
    xmlPatternPtr comp;

    if ((reader == NULL) || (pattern == NULL))
	return(-1);

    comp = xmlPatterncompile(pattern, reader->dict, 0, namespaces);
    if (comp == NULL)
        return(-1);

    if (reader->patternNr >= reader->patternMax) {
        xmlPatternPtr *tmp;
        int newSize;

        newSize = xmlGrowCapacity(reader->patternMax, sizeof(tmp[0]),
                                  4, XML_MAX_ITEMS);
        if (newSize < 0) {
            xmlTextReaderErrMemory(reader);
            return(-1);
        }
	tmp = xmlRealloc(reader->patternTab, newSize * sizeof(tmp[0]));
        if (tmp == NULL) {
            xmlTextReaderErrMemory(reader);
            return(-1);
        }
	reader->patternTab = tmp;
        reader->patternMax = newSize;
    }
    reader->patternTab[reader->patternNr] = comp;
    return(reader->patternNr++);
}